

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmodule.c
# Opt level: O0

FT_Error af_autofitter_init(FT_Module ft_module)

{
  AF_Module module;
  FT_Module ft_module_local;
  
  *(undefined4 *)&ft_module[1].clazz = 0x53;
  *(undefined4 *)((long)&ft_module[1].clazz + 4) = 0x1e;
  *(undefined1 *)&ft_module[1].library = 0;
  *(undefined1 *)((long)&ft_module[1].library + 1) = 1;
  *(undefined4 *)((long)&ft_module[1].library + 4) = 500;
  *(undefined4 *)&ft_module[1].memory = 400;
  *(undefined4 *)((long)&ft_module[1].memory + 4) = 1000;
  *(undefined4 *)&ft_module[2].clazz = 0x113;
  *(undefined4 *)((long)&ft_module[2].clazz + 4) = 0x683;
  *(undefined4 *)&ft_module[2].library = 0x113;
  *(undefined4 *)((long)&ft_module[2].library + 4) = 0x91d;
  *(undefined4 *)&ft_module[2].memory = 0;
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  af_autofitter_init( FT_Module  ft_module )      /* AF_Module */
  {
    AF_Module  module = (AF_Module)ft_module;


    module->fallback_style    = AF_STYLE_FALLBACK;
    module->default_script    = AF_SCRIPT_DEFAULT;
#ifdef AF_CONFIG_OPTION_USE_WARPER
    module->warping           = 0;
#endif
    module->no_stem_darkening = TRUE;

    module->darken_params[0]  = CFF_CONFIG_OPTION_DARKENING_PARAMETER_X1;
    module->darken_params[1]  = CFF_CONFIG_OPTION_DARKENING_PARAMETER_Y1;
    module->darken_params[2]  = CFF_CONFIG_OPTION_DARKENING_PARAMETER_X2;
    module->darken_params[3]  = CFF_CONFIG_OPTION_DARKENING_PARAMETER_Y2;
    module->darken_params[4]  = CFF_CONFIG_OPTION_DARKENING_PARAMETER_X3;
    module->darken_params[5]  = CFF_CONFIG_OPTION_DARKENING_PARAMETER_Y3;
    module->darken_params[6]  = CFF_CONFIG_OPTION_DARKENING_PARAMETER_X4;
    module->darken_params[7]  = CFF_CONFIG_OPTION_DARKENING_PARAMETER_Y4;

    return FT_Err_Ok;
  }